

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_bbox.cpp
# Opt level: O2

BBox<1> Omega_h::get_bounding_box<1>(Mesh *mesh)

{
  Vector<1> VVar1;
  BBox<1> BVar2;
  BBox<1> BVar3;
  Comm *local_30;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_28;
  
  Mesh::coords((Mesh *)&stack0xffffffffffffffe0);
  BVar2 = find_bounding_box<1>((Reals *)&stack0xffffffffffffffe0);
  Write<double>::~Write((Write<double> *)&stack0xffffffffffffffe0);
  Mesh::comm((Mesh *)&local_30);
  BVar3.min.super_Few<double,_1>.array_[0] =
       (Few<double,_1>)
       Comm::allreduce<double>
                 (local_30,(double)BVar2.min.super_Few<double,_1>.array_[0].super_Few<double,_1>,
                  OMEGA_H_MIN);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_28);
  Mesh::comm((Mesh *)&local_30);
  VVar1.super_Few<double,_1>.array_[0] =
       (Few<double,_1>)
       Comm::allreduce<double>
                 (local_30,(double)BVar2.max.super_Few<double,_1>.array_[0].super_Few<double,_1>,
                  OMEGA_H_MAX);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_28);
  BVar3.max.super_Few<double,_1>.array_[0] = VVar1.super_Few<double,_1>.array_[0];
  return BVar3;
}

Assistant:

BBox<dim> get_bounding_box(Mesh* mesh) {
  auto bb = find_bounding_box<dim>(mesh->coords());
  for (Int i = 0; i < dim; ++i) {
    bb.min[i] = mesh->comm()->allreduce(bb.min[i], OMEGA_H_MIN);
    bb.max[i] = mesh->comm()->allreduce(bb.max[i], OMEGA_H_MAX);
  }
  return bb;
}